

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

RedactionState google::protobuf::TextFormat::GetRedactionState(FieldDescriptor *field)

{
  bool bVar1;
  RedactionState RVar2;
  FieldOptions *from;
  Reflection *this;
  reference ppFVar3;
  byte local_131;
  byte local_123;
  RedactionState local_104;
  bool local_102;
  bool bStack_101;
  RedactionState result;
  FieldDescriptor *option;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  Reflection *reflection;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  field_options;
  undefined1 local_b0 [8];
  FieldOptions options;
  FieldDescriptor *field_local;
  RedactionState state;
  
  options.field_0._128_8_ = field;
  from = FieldDescriptor::options(field);
  FieldOptions::FieldOptions((FieldOptions *)local_b0,from);
  bVar1 = FieldOptions::debug_redact((FieldOptions *)local_b0);
  field_local._6_2_ = (RedactionState)(ushort)bVar1;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&reflection);
  this = FieldOptions::GetReflection();
  Reflection::ListFields
            (this,(Message *)local_b0,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&reflection);
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&reflection);
  option = (FieldDescriptor *)
           std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&reflection);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&option);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    RVar2 = IsOptionSensitive((Message *)local_b0,this,*ppFVar3);
    local_123 = 1;
    if (((ushort)field_local._6_2_ & 1) == 0) {
      local_102 = RVar2.redact;
      local_123 = local_102;
    }
    local_104.redact = (bool)(local_123 & 1);
    local_131 = 1;
    if (((ushort)field_local._6_2_ & 0x100) == 0) {
      bStack_101 = RVar2.report;
      local_131 = bStack_101;
    }
    local_104.report = (bool)(local_131 & 1);
    field_local._6_2_ = local_104;
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)&reflection);
  FieldOptions::~FieldOptions((FieldOptions *)local_b0);
  return field_local._6_2_;
}

Assistant:

TextFormat::RedactionState TextFormat::GetRedactionState(
    const FieldDescriptor* field) {
  auto options = field->options();
  auto state = TextFormat::RedactionState{options.debug_redact(), false};
  std::vector<const FieldDescriptor*> field_options;
  const Reflection* reflection = options.GetReflection();
  reflection->ListFields(options, &field_options);
  for (const FieldDescriptor* option : field_options) {
    auto result = TextFormat::IsOptionSensitive(options, reflection, option);
    state = TextFormat::RedactionState{state.redact || result.redact,
                                       state.report || result.report};
  }
  return state;
}